

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O3

StringRef __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::consumeOneOption
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,StringRef *Style,
          char Indicator,StringRef Default)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  ulong __n;
  StringRef SVar7;
  
  pcVar6 = (char *)CONCAT71(in_register_00000011,Indicator);
  pcVar5 = Default.Data;
  if ((*(long *)(this + 8) != 0) && (pcVar1 = *(char **)this, *pcVar1 == (char)Style)) {
    pcVar5 = pcVar1 + 1;
    *(char **)this = pcVar5;
    __n = *(long *)(this + 8) - 1;
    *(ulong *)(this + 8) = __n;
    if (__n == 0) {
      __assert_fail("false && \"Invalid range style\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x170,
                    "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                   );
    }
    lVar3 = 0;
    while (*pcVar5 != **(char **)((long)&DAT_01078b80 + lVar3)) {
      lVar3 = lVar3 + 8;
      if (lVar3 == 0x18) {
        __assert_fail("false && \"Invalid range style!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                      ,0x180,
                      "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                     );
      }
    }
    pvVar2 = memchr(pcVar5,(int)(*(char **)((long)&DAT_01078b80 + lVar3))[1],__n);
    if ((pvVar2 == (void *)0x0) ||
       (uVar4 = (long)pvVar2 - (long)pcVar5, uVar4 == 0xffffffffffffffff)) {
      __assert_fail("false && \"Missing range option end delimeter!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x179,
                    "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                   );
    }
    if (__n <= uVar4) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    pcVar5 = (char *)((uVar4 - 1) + (ulong)(uVar4 == 0));
    pcVar6 = pcVar1 + 2;
    *(char **)this = pcVar1 + uVar4 + 2;
    *(ulong *)(this + 8) = __n - (uVar4 + 1);
  }
  SVar7.Length = (size_t)pcVar5;
  SVar7.Data = pcVar6;
  return SVar7;
}

Assistant:

static StringRef consumeOneOption(StringRef &Style, char Indicator,
                                    StringRef Default) {
    if (Style.empty())
      return Default;
    if (Style.front() != Indicator)
      return Default;
    Style = Style.drop_front();
    if (Style.empty()) {
      assert(false && "Invalid range style");
      return Default;
    }

    for (const char *D : {"[]", "<>", "()"}) {
      if (Style.front() != D[0])
        continue;
      size_t End = Style.find_first_of(D[1]);
      if (End == StringRef::npos) {
        assert(false && "Missing range option end delimeter!");
        return Default;
      }
      StringRef Result = Style.slice(1, End);
      Style = Style.drop_front(End + 1);
      return Result;
    }
    assert(false && "Invalid range style!");
    return Default;
  }